

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::insert_move_before(xml_node *this,xml_node *moved,xml_node *node)

{
  ulong *puVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  bool bVar5;
  xml_node_struct **ppxVar6;
  xml_node_struct *pxVar7;
  xml_node local_20;
  
  bVar5 = impl::anon_unknown_0::allow_move((xml_node)this->_root,(xml_node)moved->_root);
  if ((((bVar5) && (pxVar2 = node->_root, pxVar2 != (xml_node_struct *)0x0)) &&
      (pxVar3 = this->_root, pxVar2->parent == pxVar3)) && (pxVar4 = moved->_root, pxVar4 != pxVar2)
     ) {
    if (pxVar3 == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x486,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    puVar1 = (ulong *)(*(long *)((long)pxVar3 - (pxVar3->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    pxVar2 = pxVar4->parent;
    pxVar3 = pxVar4->next_sibling;
    pxVar7 = pxVar3;
    if (pxVar3 == (xml_node_struct *)0x0) {
      pxVar7 = pxVar2->first_child;
    }
    pxVar7->prev_sibling_c = pxVar4->prev_sibling_c;
    ppxVar6 = &pxVar2->first_child;
    if (pxVar4->prev_sibling_c->next_sibling != (xml_node_struct *)0x0) {
      ppxVar6 = &pxVar4->prev_sibling_c->next_sibling;
    }
    *ppxVar6 = pxVar3;
    pxVar4->parent = (xml_node_struct *)0x0;
    pxVar4->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar4->next_sibling = (xml_node_struct *)0x0;
    pxVar2 = moved->_root;
    pxVar3 = node->_root;
    pxVar4 = pxVar3->parent;
    pxVar2->parent = pxVar4;
    pxVar7 = pxVar3->prev_sibling_c;
    ppxVar6 = &pxVar4->first_child;
    if (pxVar7->next_sibling != (xml_node_struct *)0x0) {
      ppxVar6 = &pxVar7->next_sibling;
    }
    *ppxVar6 = pxVar2;
    pxVar2->prev_sibling_c = pxVar7;
    pxVar2->next_sibling = pxVar3;
    pxVar3->prev_sibling_c = pxVar2;
    local_20 = (xml_node)moved->_root;
  }
  else {
    xml_node(&local_20);
  }
  return (xml_node)local_20._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_before(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_before(moved._root, node._root);

		return moved;
	}